

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O1

int cvLsPrecSetupBWrapper
              (sunrealtype t,N_Vector yB,N_Vector fyB,int jokB,int *jcurPtrB,sunrealtype gammaB,
              void *cvode_mem)

{
  int iVar1;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVLsMemB local_50;
  CVodeBMem local_48;
  CVadjMem local_40;
  CVodeMem local_38;
  
  iVar1 = cvLs_AccessLMemBCur(cvode_mem,"cvLsPrecSetupBWrapper",&local_38,&local_40,&local_48,
                              &local_50);
  if (iVar1 == 0) {
    iVar1 = (*local_40->ca_IMget)(local_38,t,local_40->ca_ytmp,(N_Vector *)0x0);
    if (iVar1 == 0) {
      iVar1 = (*local_50->psetB)(t,local_40->ca_ytmp,yB,fyB,jokB,jcurPtrB,gammaB,
                                 local_48->cv_user_data);
      return iVar1;
    }
    iVar1 = -1;
    cvProcessError(local_38,-1,0x9df,"cvLsPrecSetupBWrapper",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_ls.c"
                   ,"Bad t for interpolation.");
  }
  return iVar1;
}

Assistant:

static int cvLsPrecSetupBWrapper(sunrealtype t, N_Vector yB, N_Vector fyB,
                                 sunbooleantype jokB, sunbooleantype* jcurPtrB,
                                 sunrealtype gammaB, void* cvode_mem)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemBCur(cvode_mem, "cvLsPrecSetupBWrapper", &cv_mem,
                               &ca_mem, &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Get forward solution from interpolation */
  retval = ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, NULL);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSG_LS_BAD_TINTERP);
    return (-1);
  }

  /* Call user's adjoint precondB routine */
  return (cvlsB_mem->psetB(t, ca_mem->ca_ytmp, yB, fyB, jokB, jcurPtrB, gammaB,
                           cvB_mem->cv_user_data));
}